

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O2

vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
ear::GainCalculatorDirectSpeakersImpl::_findCandidates
          (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,GainCalculatorDirectSpeakersImpl *this,PolarSpeakerPosition *pos,
          bool isLfe,double tol)

{
  VectorXd *this_00;
  double start;
  double end;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  reference_const_type pdVar6;
  vector<ear::Channel,_std::allocator<ear::Channel>_> *pvVar7;
  Scalar *pSVar8;
  Scalar *pSVar9;
  long lVar10;
  long index;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *candidates;
  RowVector3d cartPosition;
  Channel channel;
  PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> local_220 [24];
  undefined1 local_208 [72];
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_1c0;
  Channel local_188;
  PolarSpeakerPosition local_f8;
  
  PolarSpeakerPosition::PolarSpeakerPosition(&local_f8,pos);
  toCartesianVector3d((Vector3d *)&local_188,&local_f8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>
            (local_220,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_188);
  ScreenEdgeLock::~ScreenEdgeLock(&local_f8.screenEdgeLock);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar6 = boost::optional<double>::get_value_or(&pos->azimuthMin,&pos->azimuth);
  start = *pdVar6;
  pdVar6 = boost::optional<double>::get_value_or(&pos->azimuthMax,&pos->azimuth);
  end = *pdVar6;
  pdVar6 = boost::optional<double>::get_value_or(&pos->elevationMin,&pos->elevation);
  dVar1 = *pdVar6;
  pdVar6 = boost::optional<double>::get_value_or(&pos->elevationMax,&pos->elevation);
  dVar2 = *pdVar6;
  pdVar6 = boost::optional<double>::get_value_or(&pos->distanceMin,&pos->distance);
  dVar3 = *pdVar6;
  pdVar6 = boost::optional<double>::get_value_or(&pos->distanceMax,&pos->distance);
  this_00 = &this->_elevations;
  dVar4 = *pdVar6;
  lVar10 = 0;
  index = 0;
  do {
    if (this->_nChannels <= index) {
      return __return_storage_ptr__;
    }
    pvVar7 = Layout::channels(&this->_layout);
    Channel::Channel(&local_188,
                     (Channel *)
                     ((long)&(((pvVar7->
                               super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>).
                               _M_impl.super__Vector_impl_data._M_start)->_name)._M_dataplus._M_p +
                     lVar10));
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Array<bool,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Array<bool,__1,_1,_0,__1,_1>,_1> *)&this->_isLfe,
                        index);
    if (*pSVar8 == isLfe) {
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &this->_azimuths,index);
      bVar5 = insideAngleRange(*pSVar9,start,end,tol);
      if (!bVar5) {
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                            index);
        if (ABS(*pSVar9) < 90.0 - tol) goto LAB_00156dcc;
      }
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                          index);
      if (dVar1 - tol < *pSVar9) {
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                            index);
        if (*pSVar9 <= dVar2 + tol && dVar2 + tol != *pSVar9) {
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              &this->_distances,index);
          if (dVar3 - tol < *pSVar9) {
            pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                &this->_distances,index);
            if (*pSVar9 <= dVar4 + tol && dVar4 + tol != *pSVar9) {
              Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                        (&local_1c0,&this->_positions,index);
              Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>::
              operator-((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                         *)local_208,
                        (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>> *)
                        &local_1c0,(MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)local_220);
              local_208._8_8_ =
                   Eigen::
                   MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                   ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                           *)local_208);
              local_208._0_4_ = (undefined4)index;
              std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
              emplace_back<std::pair<int,double>>
                        ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                         __return_storage_ptr__,(pair<int,_double> *)local_208);
            }
          }
        }
      }
    }
LAB_00156dcc:
    Channel::~Channel(&local_188);
    index = index + 1;
    lVar10 = lVar10 + 0x90;
  } while( true );
}

Assistant:

std::vector<std::pair<int, double>>
  GainCalculatorDirectSpeakersImpl::_findCandidates(
      const PolarSpeakerPosition& pos, bool isLfe, double tol) {
    Eigen::RowVector3d cartPosition = toCartesianVector3d(pos);
    std::vector<std::pair<int, double>> candidates;
    double azMin = boost::get_optional_value_or(pos.azimuthMin, pos.azimuth);
    double azMax = boost::get_optional_value_or(pos.azimuthMax, pos.azimuth);
    double elMin =
        boost::get_optional_value_or(pos.elevationMin, pos.elevation);
    double elMax =
        boost::get_optional_value_or(pos.elevationMax, pos.elevation);
    double distMin =
        boost::get_optional_value_or(pos.distanceMin, pos.distance);
    double distMax =
        boost::get_optional_value_or(pos.distanceMax, pos.distance);
    for (int i = 0; i < _nChannels; ++i) {
      Channel channel = _layout.channels()[i];
      if (isLfe == _isLfe[i]) {
        if ((insideAngleRange(_azimuths(i), azMin, azMax, tol) ||
             std::abs(_elevations(i)) >= 90.0 - tol) &&
            (_elevations(i) > elMin - tol) && (_elevations(i) < elMax + tol) &&
            (_distances(i) > distMin - tol) &&
            (_distances(i) < distMax + tol)) {
          double distance = (_positions.row(i) - cartPosition).norm();
          candidates.push_back(std::make_pair(i, distance));
        }
      }
    }
    return candidates;
  }